

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O2

Index __thiscall
MADPComponentDiscreteStates::GetStateIndexByName(MADPComponentDiscreteStates *this,string *s)

{
  pointer pSVar1;
  __type_conflict _Var2;
  ostream *poVar3;
  E *pEVar4;
  Index unaff_EBP;
  pointer pSVar5;
  stringstream ss;
  ostream local_1a8 [376];
  
  if (this->_m_initialized == false) {
    pEVar4 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar4,"MADPComponentDiscreteStates::GetStateIndexByName - not initialized!");
    __cxa_throw(pEVar4,&E::typeinfo,E::~E);
  }
  pSVar5 = (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pSVar5 == pSVar1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar3 = std::operator<<(local_1a8,"GetStateIndexByName - state \"");
      poVar3 = std::operator<<(poVar3,(string *)s);
      poVar3 = std::operator<<(poVar3,"\" not found.");
      std::endl<char,std::char_traits<char>>(poVar3);
      pEVar4 = (E *)__cxa_allocate_exception(0x28);
      E::E(pEVar4,&ss);
      __cxa_throw(pEVar4,&E::typeinfo,E::~E);
    }
    std::__cxx11::string::string
              ((string *)&ss,(string *)&(pSVar5->super_State).super_NamedDescribedEntity._m_name);
    _Var2 = std::operator==(s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &ss);
    if (_Var2) {
      unaff_EBP = (pSVar5->super_DiscreteEntity)._m_index;
    }
    else {
      pSVar5 = pSVar5 + 1;
    }
    std::__cxx11::string::~string((string *)&ss);
  } while (!_Var2);
  return unaff_EBP;
}

Assistant:

Index MADPComponentDiscreteStates::GetStateIndexByName(const string &s) const
{
    if(!_m_initialized)
        throw E("MADPComponentDiscreteStates::GetStateIndexByName - not initialized!");

    vector<StateDiscrete>::const_iterator it = _m_stateVec.begin();
    vector<StateDiscrete>::const_iterator last = _m_stateVec.end();
    while(it != last)
    {
        string s2 = (*it).GetName();
        if(s == s2)
        //if(strcmp(s,s2) == 0)//match
            return( (*it).GetIndex() );
        it++;
    }
    //not found
    //return(-1);
    stringstream ss;
    ss << "GetStateIndexByName - state \"" << s << "\" not found." << endl;
    throw E(ss);

}